

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.hpp
# Opt level: O0

void quit(char *format,...)

{
  FILE *__stream;
  char in_AL;
  int *piVar1;
  char *pcVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  undefined1 local_d8 [8];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined4 local_28;
  undefined4 local_24;
  undefined1 *local_20;
  undefined1 *local_18;
  char *local_8;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  local_18 = local_d8;
  local_20 = &stack0x00000008;
  local_24 = 0x30;
  local_28 = 8;
  local_d0 = in_RSI;
  local_c8 = in_RDX;
  local_c0 = in_RCX;
  local_b8 = in_R8;
  local_b0 = in_R9;
  local_8 = in_RDI;
  fprintf(_stderr,"error: ");
  vfprintf(_stderr,local_8,&local_28);
  piVar1 = __errno_location();
  __stream = _stderr;
  if (*piVar1 == 0) {
    fprintf(_stderr,"\n");
  }
  else {
    piVar1 = __errno_location();
    pcVar2 = strerror(*piVar1);
    fprintf(__stream,": %s\n",pcVar2);
  }
  fflush(_stderr);
  exit(1);
}

Assistant:

void quit(const char* format, ...)
{
    va_list args;
    va_start(args, format);
    fprintf(stderr, "error: ");
    vfprintf(stderr, format, args);
    va_end(args);
    if (errno != 0) {
        fprintf(stderr, ": %s\n", strerror(errno));
    } else {
        fprintf(stderr, "\n");
    }
    fflush(stderr);
    exit(EXIT_FAILURE);
}